

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_application-api.cpp
# Opt level: O2

void __thiscall
AdiakApplicationAPI_CXX_CompoundTypes_Test::~AdiakApplicationAPI_CXX_CompoundTypes_Test
          (AdiakApplicationAPI_CXX_CompoundTypes_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AdiakApplicationAPI, CXX_CompoundTypes)
{
    EXPECT_TRUE(adiak::value("cxx:range:double", -1.0, 1.0));

    auto v_t = std::make_tuple(std::string("one"), 1ull);
    std::vector<int> v_ints { 1, 2, 3 };
    std::vector<std::tuple<const char*,int>> v_tuples {
        { "one", 1 }, { "two", 2 }, { "three", 3 }
    };

    EXPECT_TRUE(adiak::value("cxx:tuple", v_t));
    EXPECT_TRUE(adiak::value("cxx:vec:int", v_ints));
    EXPECT_TRUE(adiak::value("cxx:vec:tpl", v_tuples));

    adiak_datatype_t* dtype = nullptr;
    adiak_value_t* val = nullptr;
    int cat = 0;
    const char* subcat = nullptr;
    adiak_value_t subval;
    adiak_datatype_t* subtype = nullptr;


    EXPECT_EQ(adiak_get_nameval("cxx:range:double", &dtype, &val, &cat, &subcat), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_range);
    EXPECT_EQ(cat, adiak_general);
    EXPECT_EQ(adiak_num_subvals(dtype), 2);
    EXPECT_EQ(adiak_get_subval(dtype, val, 0, &subtype, &subval), 0);
    EXPECT_EQ(subtype->dtype, adiak_type_t::adiak_double);
    EXPECT_EQ(subval.v_double, -1.0);
    EXPECT_EQ(adiak_get_subval(dtype, val, 1, &subtype, &subval), 0);
    EXPECT_EQ(subtype->dtype, adiak_type_t::adiak_double);
    EXPECT_EQ(subval.v_double, 1.0);

    EXPECT_EQ(adiak_get_nameval("cxx:tuple", &dtype, &val, &cat, &subcat), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_tuple);
    EXPECT_EQ(cat, adiak_general);
    EXPECT_EQ(adiak_num_subvals(dtype), 2);
    EXPECT_EQ(adiak_get_subval(dtype, val, 0, &subtype, &subval), 0);
    EXPECT_EQ(subtype->dtype, adiak_type_t::adiak_string);
    EXPECT_STREQ(static_cast<const char*>(subval.v_ptr), "one");
    EXPECT_EQ(adiak_get_subval(dtype, val, 1, &subtype, &subval), 0);
    EXPECT_EQ(subtype->dtype, adiak_type_t::adiak_ulonglong);
    EXPECT_EQ(static_cast<unsigned long long>(subval.v_longlong), 1ull);

    EXPECT_EQ(adiak_get_nameval("cxx:vec:int", &dtype, &val, &cat, &subcat), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_list);
    EXPECT_EQ(cat, adiak_general);
    EXPECT_EQ(adiak_num_subvals(dtype), 3);
    EXPECT_EQ(adiak_get_subval(dtype, val, 0, &subtype, &subval), 0);
    EXPECT_EQ(subtype->dtype, adiak_type_t::adiak_int);
    EXPECT_EQ(subval.v_int, 1);
    EXPECT_EQ(adiak_get_subval(dtype, val, 2, &subtype, &subval), 0);
    EXPECT_EQ(subtype->dtype, adiak_type_t::adiak_int);
    EXPECT_EQ(subval.v_int, 3);

    EXPECT_EQ(adiak_get_nameval("cxx:vec:tpl", &dtype, &val, &cat, &subcat), 0);
    EXPECT_EQ(dtype->dtype, adiak_type_t::adiak_list);
    EXPECT_EQ(cat, adiak_general);
    EXPECT_EQ(adiak_num_subvals(dtype), 3);
    EXPECT_EQ(adiak_get_subval(dtype, val, 2, &subtype, &subval), 0);
    adiak_datatype_t *inner_subtype;
    adiak_value_t inner_subval;
    EXPECT_EQ(subtype->dtype, adiak_type_t::adiak_tuple);
    EXPECT_EQ(adiak_num_subvals(subtype), 2);
    EXPECT_EQ(adiak_get_subval(subtype, &subval, 1, &inner_subtype, &inner_subval), 0);
    EXPECT_EQ(inner_subtype->dtype, adiak_type_t::adiak_int);
    EXPECT_EQ(inner_subval.v_int, 3);
}